

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

TemplateCache * __thiscall ctemplate::TemplateCache::Clone(TemplateCache *this)

{
  bool bVar1;
  TemplateCache *this_00;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
  local_38;
  iterator it;
  TemplateCache *new_cache;
  ReaderMutexLock ml;
  TemplateCache *this_local;
  
  ml.mu_ = (Mutex *)this;
  ReaderMutexLock::ReaderMutexLock((ReaderMutexLock *)&new_cache,this->mutex_);
  this_00 = (TemplateCache *)operator_new(0x40);
  TemplateCache(this_00);
  std::
  unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
  ::operator=(this_00->parsed_template_cache_,this->parsed_template_cache_);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
       ::begin(this->parsed_template_cache_);
  while( true ) {
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
         ::end(this->parsed_template_cache_);
    bVar1 = std::__detail::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                           *)&local_38);
    RefcountedTemplate::IncRef((ppVar2->second).refcounted_tpl);
    std::__detail::
    _Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                  *)&local_38);
  }
  ReaderMutexLock::~ReaderMutexLock((ReaderMutexLock *)&new_cache);
  return this_00;
}

Assistant:

TemplateCache* TemplateCache::Clone() const {
  ReaderMutexLock ml(mutex_);
  TemplateCache* new_cache = new TemplateCache();
  *(new_cache->parsed_template_cache_) = *parsed_template_cache_;
  for (TemplateMap::iterator it = parsed_template_cache_->begin();
       it != parsed_template_cache_->end(); ++it) {
    it->second.refcounted_tpl->IncRef();
  }

  return new_cache;
}